

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

size_t __thiscall czh::file::NonStreamFile::get_arrowpos(NonStreamFile *this,size_t pos)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar3 = (long)((int)pos + -1);
  if (pos == 1) {
    uVar3 = 1;
  }
  do {
    uVar1 = uVar3 - 1;
    if ((long)uVar3 < 0) break;
    pcVar2 = (this->code)._M_dataplus._M_p + uVar3;
    uVar3 = uVar1;
  } while (*pcVar2 != '\n');
  return ~uVar1 + pos;
}

Assistant:

[[nodiscard]] std::size_t get_arrowpos(std::size_t pos) const override
    {
      int i = static_cast<int>(pos);
      if (pos != 1)
        --i;
      while (code[i] != '\n' && i >= 0)
        --i;
      return pos - i;
    }